

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u8 sqlite3GetVarint(uchar *p,u64 *v)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  u32 s;
  u32 b;
  u32 a;
  u64 *v_local;
  uchar *p_local;
  
  uVar1 = (uint)*p;
  if ((*p & 0x80) == 0) {
    *v = (ulong)uVar1;
    p_local._7_1_ = '\x01';
  }
  else {
    uVar2 = (uint)p[1];
    if ((p[1] & 0x80) == 0) {
      *v = (ulong)(uVar2 | (uVar1 & 0x7f) << 7);
      p_local._7_1_ = '\x02';
    }
    else {
      uVar1 = (uint)p[2] | uVar1 << 0xe;
      if ((p[2] & 0x80) == 0) {
        *v = (ulong)((uVar2 & 0x7f) << 7 | uVar1 & 0x1fc07f);
        p_local._7_1_ = '\x03';
      }
      else {
        uVar1 = uVar1 & 0x1fc07f;
        uVar2 = (uint)p[3] | uVar2 << 0xe;
        if ((p[3] & 0x80) == 0) {
          *v = (ulong)(uVar2 & 0x1fc07f | uVar1 << 7);
          p_local._7_1_ = '\x04';
        }
        else {
          uVar2 = uVar2 & 0x1fc07f;
          uVar3 = (uint)p[4] | uVar1 << 0xe;
          if ((p[4] & 0x80) == 0) {
            *v = CONCAT44(uVar1 >> 0x12,uVar2 << 7 | uVar3);
            p_local._7_1_ = '\x05';
          }
          else {
            uVar1 = uVar2 | uVar1 << 7;
            uVar2 = (uint)p[5] | uVar2 << 0xe;
            if ((p[5] & 0x80) == 0) {
              *v = CONCAT44(uVar1 >> 0x12,uVar2 | (uVar3 & 0x1fc07f) << 7);
              p_local._7_1_ = '\x06';
            }
            else {
              uVar3 = (uint)p[6] | uVar3 << 0xe;
              if ((p[6] & 0x80) == 0) {
                *v = CONCAT44(uVar1 >> 0xb,(uVar2 & 0x1fc07f) << 7 | uVar3 & 0xf01fc07f);
                p_local._7_1_ = '\a';
              }
              else {
                uVar3 = uVar3 & 0x1fc07f;
                uVar2 = (uint)p[7] | uVar2 << 0xe;
                if ((p[7] & 0x80) == 0) {
                  *v = CONCAT44(uVar1 >> 4,uVar2 & 0xf01fc07f | uVar3 << 7);
                  p_local._7_1_ = '\b';
                }
                else {
                  *v = CONCAT44((p[4] & 0x7f) >> 3 | uVar1 << 4,
                                (uVar2 & 0x1fc07f) << 8 | (uint)p[8] | uVar3 << 0xf);
                  p_local._7_1_ = '\t';
                }
              }
            }
          }
        }
      }
    }
  }
  return p_local._7_1_;
}

Assistant:

SQLITE_PRIVATE u8 sqlite3GetVarint(const unsigned char *p, u64 *v){
  u32 a,b,s;

  a = *p;
  /* a: p0 (unmasked) */
  if (!(a&0x80))
  {
    *v = a;
    return 1;
  }

  p++;
  b = *p;
  /* b: p1 (unmasked) */
  if (!(b&0x80))
  {
    a &= 0x7f;
    a = a<<7;
    a |= b;
    *v = a;
    return 2;
  }

  /* Verify that constants are precomputed correctly */
  assert( SLOT_2_0 == ((0x7f<<14) | (0x7f)) );
  assert( SLOT_4_2_0 == ((0xfU<<28) | (0x7f<<14) | (0x7f)) );

  p++;
  a = a<<14;
  a |= *p;
  /* a: p0<<14 | p2 (unmasked) */
  if (!(a&0x80))
  {
    a &= SLOT_2_0;
    b &= 0x7f;
    b = b<<7;
    a |= b;
    *v = a;
    return 3;
  }

  /* CSE1 from below */
  a &= SLOT_2_0;
  p++;
  b = b<<14;
  b |= *p;
  /* b: p1<<14 | p3 (unmasked) */
  if (!(b&0x80))
  {
    b &= SLOT_2_0;
    /* moved CSE1 up */
    /* a &= (0x7f<<14)|(0x7f); */
    a = a<<7;
    a |= b;
    *v = a;
    return 4;
  }

  /* a: p0<<14 | p2 (masked) */
  /* b: p1<<14 | p3 (unmasked) */
  /* 1:save off p0<<21 | p1<<14 | p2<<7 | p3 (masked) */
  /* moved CSE1 up */
  /* a &= (0x7f<<14)|(0x7f); */
  b &= SLOT_2_0;
  s = a;
  /* s: p0<<14 | p2 (masked) */

  p++;
  a = a<<14;
  a |= *p;
  /* a: p0<<28 | p2<<14 | p4 (unmasked) */
  if (!(a&0x80))
  {
    /* we can skip these cause they were (effectively) done above in calc'ing s */
    /* a &= (0x7f<<28)|(0x7f<<14)|(0x7f); */
    /* b &= (0x7f<<14)|(0x7f); */
    b = b<<7;
    a |= b;
    s = s>>18;
    *v = ((u64)s)<<32 | a;
    return 5;
  }

  /* 2:save off p0<<21 | p1<<14 | p2<<7 | p3 (masked) */
  s = s<<7;
  s |= b;
  /* s: p0<<21 | p1<<14 | p2<<7 | p3 (masked) */

  p++;
  b = b<<14;
  b |= *p;
  /* b: p1<<28 | p3<<14 | p5 (unmasked) */
  if (!(b&0x80))
  {
    /* we can skip this cause it was (effectively) done above in calc'ing s */
    /* b &= (0x7f<<28)|(0x7f<<14)|(0x7f); */
    a &= SLOT_2_0;
    a = a<<7;
    a |= b;
    s = s>>18;
    *v = ((u64)s)<<32 | a;
    return 6;
  }

  p++;
  a = a<<14;
  a |= *p;
  /* a: p2<<28 | p4<<14 | p6 (unmasked) */
  if (!(a&0x80))
  {
    a &= SLOT_4_2_0;
    b &= SLOT_2_0;
    b = b<<7;
    a |= b;
    s = s>>11;
    *v = ((u64)s)<<32 | a;
    return 7;
  }

  /* CSE2 from below */
  a &= SLOT_2_0;
  p++;
  b = b<<14;
  b |= *p;
  /* b: p3<<28 | p5<<14 | p7 (unmasked) */
  if (!(b&0x80))
  {
    b &= SLOT_4_2_0;
    /* moved CSE2 up */
    /* a &= (0x7f<<14)|(0x7f); */
    a = a<<7;
    a |= b;
    s = s>>4;
    *v = ((u64)s)<<32 | a;
    return 8;
  }

  p++;
  a = a<<15;
  a |= *p;
  /* a: p4<<29 | p6<<15 | p8 (unmasked) */

  /* moved CSE2 up */
  /* a &= (0x7f<<29)|(0x7f<<15)|(0xff); */
  b &= SLOT_2_0;
  b = b<<8;
  a |= b;

  s = s<<4;
  b = p[-4];
  b &= 0x7f;
  b = b>>3;
  s |= b;

  *v = ((u64)s)<<32 | a;

  return 9;
}